

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool GetPickListValue(ctmbstr value,PickListItems *pickList,uint *result)

{
  int iVar1;
  PickListItem *pPVar2;
  bool bVar3;
  uint local_44;
  uint i;
  ctmbstr input;
  uint ix;
  PickListItem *item;
  uint *result_local;
  PickListItems *pickList_local;
  ctmbstr value_local;
  
  input._4_4_ = 0;
  while( true ) {
    pPVar2 = *pickList + input._4_4_;
    bVar3 = false;
    if (pPVar2 != (PickListItem *)0x0) {
      bVar3 = pPVar2->label != (ctmbstr)0x0;
    }
    if (!bVar3) break;
    for (local_44 = 0; pPVar2->inputs[local_44] != (ctmbstr)0x0; local_44 = local_44 + 1) {
      iVar1 = prvTidytmbstrcasecmp(value,pPVar2->inputs[local_44]);
      if (iVar1 == 0) {
        *result = input._4_4_;
        return yes;
      }
    }
    input._4_4_ = input._4_4_ + 1;
  }
  return no;
}

Assistant:

static Bool GetPickListValue( ctmbstr value, PickListItems* pickList, uint *result )
{
    const PickListItem *item = NULL;
    uint ix = 0;

    while ( (item = &(*pickList)[ ix ]) && item->label )
    {
        ctmbstr input;
        uint i = 0;
        while ( ( input = &(*item->inputs[i]) ) )
        {
            if (TY_(tmbstrcasecmp)(value, input) == 0 )
            {
                *result = ix;
                return yes;
            }
            ++i;
        }
        ++ix;
    }

    return no;
}